

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::LangevinDynamics>::~IntegratorBuilder
          (IntegratorBuilder<OpenMD::LangevinDynamics> *this)

{
  void *in_RDI;
  
  ~IntegratorBuilder((IntegratorBuilder<OpenMD::LangevinDynamics> *)0x1f7488);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual Integrator* create(SimInfo* info) const {
      return new ConcreteIntegrator(info);
    }